

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::compileInterface
          (NodeTranslator *this,Reader decl,Reader members,Builder builder)

{
  uint uVar1;
  ErrorReporter *pEVar2;
  Reader source;
  Reader ordinal_00;
  Reader paramList;
  Reader paramList_00;
  Reader annotations;
  Reader implicitParams;
  Reader implicitParams_00;
  ImplicitParams implicitMethodParams;
  unsigned_long uVar3;
  undefined4 index;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  uint32_t uVar7;
  NullableValue<capnp::compiler::BrandedDecl> *other;
  BrandedDecl *pBVar8;
  NullableValue<capnp::compiler::Declaration::Which> *other_00;
  Which *pWVar9;
  size_type sVar10;
  reference ppVar11;
  uint64_t uVar12;
  unsigned_long *puVar13;
  char (*in_R8) [79];
  Iterator IVar14;
  Reader RVar15;
  Range<unsigned_long> RVar16;
  ArrayPtr<const_char> AVar17;
  ArrayPtr<const_char> local_b60;
  Reader local_b50;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> local_b20;
  Type local_b00 [2];
  SegmentReader *pSStack_af0;
  CapTableReader *local_ae8;
  byte *pbStack_ae0;
  ListElementCount local_ad8;
  BitsPerElementN<23> BStack_ad4;
  StructDataBitCount SStack_ad0;
  StructPointerCount SStack_acc;
  ElementSize EStack_aca;
  undefined1 uStack_ac9;
  SegmentReader *local_ac8;
  SegmentReader *pSStack_ac0;
  CapTableReader *local_ab8;
  void *pvStack_ab0;
  WirePointer *local_aa8;
  StructDataBitCount SStack_aa0;
  StructPointerCount SStack_a9c;
  undefined2 uStack_a9a;
  Reader local_a98;
  ArrayPtr<const_char> local_a68;
  ArrayPtr<const_char> local_a58;
  Reader local_a40;
  undefined1 auStack_a10 [8];
  Reader resultList;
  Reader results;
  Reader local_948;
  ArrayPtr<const_char> local_918;
  ArrayPtr<const_char> local_908;
  ArrayPtr<const_char> local_8f0;
  undefined1 auStack_8e0 [8];
  Reader params;
  Builder local_870;
  unsigned_long local_848;
  unsigned_long i_2;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_long> *__range3;
  Builder implicitsBuilder;
  Reader implicits;
  undefined1 local_780 [8];
  Builder methodBuilder;
  undefined1 local_748 [8];
  Builder sourceInfo;
  uint16_t ordinal;
  Reader local_6e8;
  undefined1 auStack_6b8 [8];
  Reader ordinalDecl;
  Reader methodReader;
  Reader methodDecl;
  uint codeOrder_1;
  pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_> *entry;
  iterator __end2_2;
  iterator __begin2_2;
  multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  *__range2_2;
  DuplicateOrdinalDetector dupDetector;
  undefined1 local_5b0 [4];
  uint i;
  undefined1 local_588 [8];
  Builder sourceInfoList;
  Builder list;
  uint local_52c;
  pair<unsigned_int,_capnp::compiler::Declaration::Reader> local_528;
  Reader local_4f0;
  Reader local_4c0;
  uint64_t local_490;
  pair<unsigned_long,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_> local_488;
  undefined1 local_448 [8];
  Reader member;
  undefined1 local_408 [8];
  Iterator __end2_1;
  undefined1 local_3e8 [8];
  Iterator __begin2_1;
  Reader *__range2_1;
  undefined1 local_3c8 [4];
  uint codeOrder;
  multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  methods;
  String local_380;
  ArrayPtr<const_char> local_368;
  String local_358;
  String local_340;
  ArrayPtr<const_char> local_328;
  Type local_318;
  undefined1 local_310 [8];
  Builder s;
  Which *kind;
  undefined1 auStack_2d8 [4];
  NullableValue<capnp::compiler::Declaration::Which> _kind1555;
  BrandedDecl *decl_1;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  Maybe<capnp::compiler::BrandedDecl> local_250;
  undefined1 local_1a0 [8];
  NullableValue<capnp::compiler::BrandedDecl> _decl1554;
  Reader superclass;
  Iterator IStack_b8;
  uint i_1;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  Builder superclassesBuilder;
  Reader superclassesDecl;
  Builder interfaceBuilder;
  NodeTranslator *this_local;
  
  capnp::schema::Node::Builder::initInterface
            ((Builder *)&superclassesDecl.reader.nestingLimit,&builder);
  Declaration::Interface::Reader::getSuperclasses
            ((Reader *)&superclassesBuilder.builder.structDataSize,&decl);
  uVar6 = List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&superclassesBuilder.builder.structDataSize);
  capnp::schema::Node::Interface::Builder::initSuperclasses
            ((Builder *)&__range2,(Builder *)&superclassesDecl.reader.nestingLimit,uVar6);
  ___begin2 = kj::indices<capnp::List<capnp::compiler::Expression,(capnp::Kind)3>::Reader&>
                        ((Reader *)&superclassesBuilder.builder.structDataSize);
  __end2 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
  IStack_b8 = kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
  while (bVar5 = kj::Range<unsigned_long>::Iterator::operator==(&__end2,&stack0xffffffffffffff48),
        ((bVar5 ^ 0xffU) & 1) != 0) {
    puVar13 = kj::Range<unsigned_long>::Iterator::operator*(&__end2);
    uVar3 = *puVar13;
    List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)&_decl1554.field_1.value.source._reader.nestingLimit,
               (Reader *)&superclassesBuilder.builder.structDataSize,(uint)uVar3);
    uVar4 = _decl1554.field_1._160_8_;
    ImplicitParams::none();
    source._reader.capTable = (CapTableReader *)superclass._reader.segment;
    source._reader.segment = (SegmentReader *)uVar4;
    source._reader.data = superclass._reader.capTable;
    source._reader.pointers = (WirePointer *)superclass._reader.data;
    source._reader._32_8_ = superclass._reader.pointers;
    source._reader._40_8_ = superclass._reader._32_8_;
    implicitMethodParams.params.reader.segment = (SegmentReader *)uStack_2b8;
    implicitMethodParams.scopeId = local_2c0;
    implicitMethodParams.params.reader.capTable = (CapTableReader *)local_2b0;
    implicitMethodParams.params.reader.ptr = (byte *)uStack_2a8;
    implicitMethodParams.params.reader._24_8_ = local_2a0;
    implicitMethodParams.params.reader._32_8_ = uStack_298;
    implicitMethodParams.params.reader._40_8_ = local_290;
    compileDeclExpression(&local_250,this,source,implicitMethodParams);
    other = kj::_::readMaybe<capnp::compiler::BrandedDecl>(&local_250);
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
              ((NullableValue<capnp::compiler::BrandedDecl> *)local_1a0,other);
    kj::Maybe<capnp::compiler::BrandedDecl>::~Maybe(&local_250);
    pBVar8 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_1a0);
    if (pBVar8 != (BrandedDecl *)0x0) {
      _auStack_2d8 = kj::_::NullableValue<capnp::compiler::BrandedDecl>::operator*
                               ((NullableValue<capnp::compiler::BrandedDecl> *)local_1a0);
      BrandedDecl::getKind((BrandedDecl *)&kind);
      other_00 = kj::_::readMaybe<capnp::compiler::Declaration::Which>
                           ((Maybe<capnp::compiler::Declaration::Which> *)&kind);
      kj::_::NullableValue<capnp::compiler::Declaration::Which>::NullableValue
                ((NullableValue<capnp::compiler::Declaration::Which> *)((long)&kind + 4),other_00);
      kj::Maybe<capnp::compiler::Declaration::Which>::~Maybe
                ((Maybe<capnp::compiler::Declaration::Which> *)&kind);
      pWVar9 = kj::_::NullableValue::operator_cast_to_Which_((NullableValue *)((long)&kind + 4));
      uVar4 = _auStack_2d8;
      if (pWVar9 == (Which *)0x0) {
        pEVar2 = this->errorReporter;
        BrandedDecl::toString
                  ((String *)&methods._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (BrandedDecl *)_auStack_2d8);
        kj::str<char_const(&)[2],kj::String,char_const(&)[79]>
                  (&local_380,(kj *)0x2d7cf1,
                   (char (*) [2])&methods._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (String *)
                   "\' is an unbound generic parameter. Currently we don\'t support extending these."
                   ,in_R8);
        kj::StringPtr::StringPtr((StringPtr *)&local_368,&local_380);
        BrandedDecl::addError((BrandedDecl *)uVar4,pEVar2,(StringPtr)local_368);
        kj::String::~String(&local_380);
        kj::String::~String((String *)&methods._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        s._builder._32_8_ =
             kj::_::NullableValue<capnp::compiler::Declaration::Which>::operator*
                       ((NullableValue<capnp::compiler::Declaration::Which> *)((long)&kind + 4));
        uVar4 = _auStack_2d8;
        if (*(Which *)s._builder._32_8_ == INTERFACE) {
          List<capnp::schema::Superclass,_(capnp::Kind)3>::Builder::operator[]
                    ((Builder *)local_310,(Builder *)&__range2,(uint)uVar3);
          local_318.s = (Builder *)local_310;
          uVar12 = BrandedDecl::
                   getIdAndFillBrand<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__0>
                             ((BrandedDecl *)_auStack_2d8,&local_318);
          capnp::schema::Superclass::Builder::setId((Builder *)local_310,uVar12);
        }
        else {
          pEVar2 = this->errorReporter;
          BrandedDecl::toString(&local_358,(BrandedDecl *)_auStack_2d8);
          kj::str<char_const(&)[2],kj::String,char_const(&)[23]>
                    (&local_340,(kj *)0x2d7cf1,(char (*) [2])&local_358,
                     (String *)"\' is not an interface.",(char (*) [23])in_R8);
          kj::StringPtr::StringPtr((StringPtr *)&local_328,&local_340);
          BrandedDecl::addError((BrandedDecl *)uVar4,pEVar2,(StringPtr)local_328);
          kj::String::~String(&local_340);
          kj::String::~String(&local_358);
        }
      }
      kj::_::NullableValue<capnp::compiler::Declaration::Which>::~NullableValue
                ((NullableValue<capnp::compiler::Declaration::Which> *)((long)&kind + 4));
    }
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
              ((NullableValue<capnp::compiler::BrandedDecl> *)local_1a0);
    kj::Range<unsigned_long>::Iterator::operator++(&__end2);
  }
  std::
  multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  ::multimap((multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
              *)local_3c8);
  __range2_1._4_4_ = 0;
  __begin2_1._8_8_ = &members;
  IVar14 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::begin(&members);
  __end2_1._8_8_ = IVar14.container;
  __begin2_1.container._0_4_ = IVar14.index;
  local_3e8 = (undefined1  [8])__end2_1._8_8_;
  IVar14 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::end
                     ((Reader *)__begin2_1._8_8_);
  member._reader._40_8_ = IVar14.container;
  __end2_1.container._0_4_ = IVar14.index;
  local_408 = (undefined1  [8])member._reader._40_8_;
  while (bVar5 = capnp::_::
                 IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                 ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                               *)local_3e8,
                              (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                               *)local_408), ((bVar5 ^ 0xffU) & 1) != 0) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator*((Reader *)local_448,
                (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                 *)local_3e8);
    bVar5 = Declaration::Reader::isMethod((Reader *)local_448);
    if (bVar5) {
      Declaration::Reader::getId(&local_4f0,(Reader *)local_448);
      Declaration::Id::Reader::getOrdinal(&local_4c0,&local_4f0);
      local_490 = LocatedInteger::Reader::getValue(&local_4c0);
      local_52c = __range2_1._4_4_;
      std::make_pair<unsigned_int,capnp::compiler::Declaration::Reader&>
                (&local_528,&local_52c,(Reader *)local_448);
      std::make_pair<unsigned_long,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>
                (&local_488,&local_490,&local_528);
      std::
      multimap<unsigned_int,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>>
      ::
      insert<std::pair<unsigned_long,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>
                ((multimap<unsigned_int,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>>
                  *)local_3c8,&local_488);
      __range2_1._4_4_ = __range2_1._4_4_ + 1;
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                  *)local_3e8);
  }
  sVar10 = std::
           multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
           ::size((multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
                   *)local_3c8);
  capnp::schema::Node::Interface::Builder::initMethods
            ((Builder *)&sourceInfoList.builder.structDataSize,
             (Builder *)&superclassesDecl.reader.nestingLimit,(uint)sVar10);
  Orphan<capnp::schema::Node::SourceInfo>::get
            ((BuilderFor<capnp::schema::Node::SourceInfo> *)local_5b0,&this->sourceInfo);
  sVar10 = std::
           multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
           ::size((multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
                   *)local_3c8);
  capnp::schema::Node::SourceInfo::Builder::initMembers
            ((Builder *)local_588,(Builder *)local_5b0,(uint)sVar10);
  dupDetector.lastOrdinalLocation.ptr.field_1._44_4_ = 0;
  DuplicateOrdinalDetector::DuplicateOrdinalDetector
            ((DuplicateOrdinalDetector *)&__range2_2,this->errorReporter);
  __end2_2 = std::
             multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
             ::begin((multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
                      *)local_3c8);
  entry = (pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>
           *)std::
             multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
             ::end((multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
                    *)local_3c8);
  while( true ) {
    bVar5 = std::operator==(&__end2_2,(_Self *)&entry);
    if (((bVar5 ^ 0xffU) & 1) == 0) break;
    ppVar11 = std::
              _Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>
              ::operator*(&__end2_2);
    uVar1 = (ppVar11->second).first;
    methodReader._reader._40_8_ = (ppVar11->second).second._reader.segment;
    Declaration::Reader::getMethod
              ((Reader *)&ordinalDecl._reader.nestingLimit,
               (Reader *)&methodReader._reader.nestingLimit);
    Declaration::Reader::getId(&local_6e8,(Reader *)&methodReader._reader.nestingLimit);
    Declaration::Id::Reader::getOrdinal((Reader *)auStack_6b8,&local_6e8);
    ordinal_00._reader.capTable = (CapTableReader *)ordinalDecl._reader.segment;
    ordinal_00._reader.segment = (SegmentReader *)auStack_6b8;
    ordinal_00._reader.data = ordinalDecl._reader.capTable;
    ordinal_00._reader.pointers = (WirePointer *)ordinalDecl._reader.data;
    ordinal_00._reader._32_8_ = ordinalDecl._reader.pointers;
    ordinal_00._reader.nestingLimit = ordinalDecl._reader.dataSize;
    ordinal_00._reader._44_2_ = ordinalDecl._reader.pointerCount;
    ordinal_00._reader._46_2_ = ordinalDecl._reader._38_2_;
    DuplicateOrdinalDetector::check((DuplicateOrdinalDetector *)&__range2_2,ordinal_00);
    uVar12 = LocatedInteger::Reader::getValue((Reader *)auStack_6b8);
    sourceInfo._builder._38_2_ = SUB82(uVar12,0);
    List<capnp::schema::Node::SourceInfo::Member,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_748,(Builder *)local_588,
               dupDetector.lastOrdinalLocation.ptr.field_1._44_4_);
    bVar5 = Declaration::Reader::hasDocComment((Reader *)&methodReader._reader.nestingLimit);
    if (bVar5) {
      RVar15 = Declaration::Reader::getDocComment((Reader *)&methodReader._reader.nestingLimit);
      methodBuilder._builder._32_8_ = RVar15.super_StringPtr.content.ptr;
      capnp::schema::Node::SourceInfo::Member::Builder::setDocComment((Builder *)local_748,RVar15);
    }
    uVar7 = Declaration::Reader::getStartByte((Reader *)&methodReader._reader.nestingLimit);
    capnp::schema::Node::SourceInfo::Member::Builder::setStartByte((Builder *)local_748,uVar7);
    uVar7 = Declaration::Reader::getEndByte((Reader *)&methodReader._reader.nestingLimit);
    capnp::schema::Node::SourceInfo::Member::Builder::setEndByte((Builder *)local_748,uVar7);
    index = dupDetector.lastOrdinalLocation.ptr.field_1._44_4_;
    dupDetector.lastOrdinalLocation.ptr.field_1._44_4_ =
         dupDetector.lastOrdinalLocation.ptr.field_1._44_4_ + 1;
    List<capnp::schema::Method,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_780,(Builder *)&sourceInfoList.builder.structDataSize,index);
    Declaration::Reader::getName
              ((Reader *)&implicits.reader.nestingLimit,(Reader *)&methodReader._reader.nestingLimit
              );
    RVar15 = LocatedText::Reader::getValue((Reader *)&implicits.reader.nestingLimit);
    capnp::schema::Method::Builder::setName((Builder *)local_780,RVar15);
    methodDecl._reader._44_2_ = SUB42(uVar1,0);
    capnp::schema::Method::Builder::setCodeOrder((Builder *)local_780,methodDecl._reader._44_2_);
    Declaration::Reader::getParameters
              ((Reader *)&implicitsBuilder.builder.structDataSize,
               (Reader *)&methodReader._reader.nestingLimit);
    uVar6 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                      ((Reader *)&implicitsBuilder.builder.structDataSize);
    capnp::schema::Method::Builder::initImplicitParameters
              ((Builder *)&__range3,(Builder *)local_780,uVar6);
    RVar16 = kj::
             indices<capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
                       ((Reader *)&implicitsBuilder.builder.structDataSize);
    __begin3.value = RVar16.begin_;
    __end3 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3);
    i_2 = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3);
    while( true ) {
      bVar5 = kj::Range<unsigned_long>::Iterator::operator==(&__end3,(Iterator *)&i_2);
      if (((bVar5 ^ 0xffU) & 1) == 0) break;
      puVar13 = kj::Range<unsigned_long>::Iterator::operator*(&__end3);
      local_848 = *puVar13;
      List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Builder::operator[]
                (&local_870,(Builder *)&__range3,(uint)local_848);
      List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::operator[]
                ((Reader *)&params._reader.nestingLimit,
                 (Reader *)&implicitsBuilder.builder.structDataSize,(uint)local_848);
      RVar15 = Declaration::BrandParameter::Reader::getName((Reader *)&params._reader.nestingLimit);
      capnp::schema::Node::Parameter::Builder::setName(&local_870,RVar15);
      kj::Range<unsigned_long>::Iterator::operator++(&__end3);
    }
    Declaration::Method::Reader::getParams
              ((Reader *)auStack_8e0,(Reader *)&ordinalDecl._reader.nestingLimit);
    bVar5 = Declaration::ParamList::Reader::isStream((Reader *)auStack_8e0);
    if (bVar5) {
      pEVar2 = this->errorReporter;
      kj::StringPtr::StringPtr
                ((StringPtr *)&local_8f0,"\'stream\' can only appear after \'->\', not before.");
      ErrorReporter::addErrorOn<capnp::compiler::Declaration::ParamList::Reader&>
                (pEVar2,(Reader *)auStack_8e0,(StringPtr)local_8f0);
    }
    Declaration::Reader::getName(&local_948,(Reader *)&methodReader._reader.nestingLimit);
    AVar17 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_948);
    results._reader._40_8_ = local_780;
    paramList._reader.capTable = (CapTableReader *)params._reader.segment;
    paramList._reader.segment = (SegmentReader *)auStack_8e0;
    paramList._reader.data = params._reader.capTable;
    paramList._reader.pointers = (WirePointer *)params._reader.data;
    paramList._reader._32_8_ = params._reader.pointers;
    paramList._reader.nestingLimit = params._reader.dataSize;
    paramList._reader._44_2_ = params._reader.pointerCount;
    paramList._reader._46_2_ = params._reader._38_2_;
    implicitParams.reader.capTable = (CapTableReader *)implicits.reader.segment;
    implicitParams.reader.segment = (SegmentReader *)implicitsBuilder.builder._32_8_;
    implicitParams.reader.ptr = (byte *)implicits.reader.capTable;
    implicitParams.reader._24_8_ = implicits.reader.ptr;
    implicitParams.reader._32_8_ = implicits.reader._24_8_;
    implicitParams.reader.nestingLimit = implicits.reader.structDataSize;
    implicitParams.reader._44_2_ = implicits.reader.structPointerCount;
    implicitParams.reader._46_1_ = implicits.reader.elementSize;
    implicitParams.reader._47_1_ = implicits.reader._39_1_;
    local_918 = AVar17;
    local_908 = AVar17;
    uVar12 = compileParamList<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__1>
                       (this,(StringPtr)AVar17,sourceInfo._builder._38_2_,false,paramList,
                        implicitParams,(Type *)&results._reader.nestingLimit);
    capnp::schema::Method::Builder::setParamStructType((Builder *)local_780,uVar12);
    Declaration::Method::Reader::getResults
              ((Reader *)&resultList._reader.nestingLimit,
               (Reader *)&ordinalDecl._reader.nestingLimit);
    Declaration::ParamList::Reader::Reader((Reader *)auStack_a10);
    bVar5 = Declaration::Method::Results::Reader::isExplicit
                      ((Reader *)&resultList._reader.nestingLimit);
    if (bVar5) {
      Declaration::Method::Results::Reader::getExplicit
                (&local_a40,(Reader *)&resultList._reader.nestingLimit);
      memcpy(auStack_a10,&local_a40,0x30);
    }
    Declaration::Reader::getName(&local_a98,(Reader *)&methodReader._reader.nestingLimit);
    AVar17 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_a98);
    local_aa8 = resultList._reader.pointers;
    SStack_aa0 = resultList._reader.dataSize;
    SStack_a9c = resultList._reader.pointerCount;
    uStack_a9a = resultList._reader._38_2_;
    local_ab8 = resultList._reader.capTable;
    pvStack_ab0 = resultList._reader.data;
    local_ac8 = (SegmentReader *)auStack_a10;
    pSStack_ac0 = resultList._reader.segment;
    local_ad8 = implicits.reader.elementCount;
    BStack_ad4 = implicits.reader.step;
    SStack_ad0 = implicits.reader.structDataSize;
    SStack_acc = implicits.reader.structPointerCount;
    EStack_aca = implicits.reader.elementSize;
    uStack_ac9 = implicits.reader._39_1_;
    local_ae8 = implicits.reader.capTable;
    pbStack_ae0 = implicits.reader.ptr;
    local_b00[1].methodBuilder = (Builder *)implicitsBuilder.builder._32_8_;
    pSStack_af0 = implicits.reader.segment;
    local_b00[0].methodBuilder = (Builder *)local_780;
    paramList_00._reader.capTable = (CapTableReader *)resultList._reader.segment;
    paramList_00._reader.segment = (SegmentReader *)auStack_a10;
    paramList_00._reader.data = resultList._reader.capTable;
    paramList_00._reader.pointers = (WirePointer *)resultList._reader.data;
    paramList_00._reader._32_8_ = resultList._reader.pointers;
    paramList_00._reader.nestingLimit = resultList._reader.dataSize;
    paramList_00._reader._44_2_ = resultList._reader.pointerCount;
    paramList_00._reader._46_2_ = resultList._reader._38_2_;
    implicitParams_00.reader.capTable = (CapTableReader *)implicits.reader.segment;
    implicitParams_00.reader.segment = (SegmentReader *)implicitsBuilder.builder._32_8_;
    implicitParams_00.reader.ptr = (byte *)implicits.reader.capTable;
    implicitParams_00.reader._24_8_ = implicits.reader.ptr;
    implicitParams_00.reader._32_8_ = implicits.reader._24_8_;
    implicitParams_00.reader.nestingLimit = implicits.reader.structDataSize;
    implicitParams_00.reader._44_2_ = implicits.reader.structPointerCount;
    implicitParams_00.reader._46_1_ = implicits.reader.elementSize;
    implicitParams_00.reader._47_1_ = implicits.reader._39_1_;
    local_a68 = AVar17;
    local_a58 = AVar17;
    uVar12 = compileParamList<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__2>
                       (this,(StringPtr)AVar17,sourceInfo._builder._38_2_,true,paramList_00,
                        implicitParams_00,local_b00);
    capnp::schema::Method::Builder::setResultStructType((Builder *)local_780,uVar12);
    Declaration::Reader::getAnnotations(&local_b50,(Reader *)&methodReader._reader.nestingLimit);
    kj::StringPtr::StringPtr((StringPtr *)&local_b60,"targetsMethod");
    annotations.reader.capTable = local_b50.reader.capTable;
    annotations.reader.segment = local_b50.reader.segment;
    annotations.reader.ptr = local_b50.reader.ptr;
    annotations.reader.elementCount = local_b50.reader.elementCount;
    annotations.reader.step = local_b50.reader.step;
    annotations.reader.structDataSize = local_b50.reader.structDataSize;
    annotations.reader.structPointerCount = local_b50.reader.structPointerCount;
    annotations.reader.elementSize = local_b50.reader.elementSize;
    annotations.reader._39_1_ = local_b50.reader._39_1_;
    annotations.reader.nestingLimit = local_b50.reader.nestingLimit;
    annotations.reader._44_4_ = local_b50.reader._44_4_;
    compileAnnotationApplications(&local_b20,this,annotations,(StringPtr)local_b60);
    capnp::schema::Method::Builder::adoptAnnotations((Builder *)local_780,&local_b20);
    Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_>::~Orphan(&local_b20);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>
    ::operator++(&__end2_2);
  }
  DuplicateOrdinalDetector::~DuplicateOrdinalDetector((DuplicateOrdinalDetector *)&__range2_2);
  std::
  multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  ::~multimap((multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
               *)local_3c8);
  return;
}

Assistant:

void NodeTranslator::compileInterface(Declaration::Interface::Reader decl,
                                      List<Declaration>::Reader members,
                                      schema::Node::Builder builder) {
  auto interfaceBuilder = builder.initInterface();

  auto superclassesDecl = decl.getSuperclasses();
  auto superclassesBuilder = interfaceBuilder.initSuperclasses(superclassesDecl.size());
  for (uint i: kj::indices(superclassesDecl)) {
    auto superclass = superclassesDecl[i];

    KJ_IF_SOME(decl, compileDeclExpression(superclass, ImplicitParams::none())) {
      KJ_IF_SOME(kind, decl.getKind()) {
        if (kind == Declaration::INTERFACE) {
          auto s = superclassesBuilder[i];
          s.setId(decl.getIdAndFillBrand([&]() { return s.initBrand(); }));
        } else {
          decl.addError(errorReporter, kj::str(
            "'", decl.toString(), "' is not an interface."));
        }
      } else {
        // A variable?
        decl.addError(errorReporter, kj::str(
            "'", decl.toString(), "' is an unbound generic parameter. Currently we don't support "
            "extending these."));
      }
    }
  }